

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_write(htsFile *hfp,bcf_hdr_t *h,bcf1_t *v)

{
  htsExactFormat hVar1;
  BGZF *fp;
  undefined8 uVar2;
  int iVar3;
  ssize_t sVar4;
  size_t sVar5;
  uint32_t x [8];
  
  if (h->dirty != 0) {
    fwrite("FIXME: dirty header not synced\n",0x1f,1,_stderr);
LAB_0011775e:
    exit(1);
  }
  if (h->n[2] == (uint)(*(ulong *)&v->field_0x10 >> 0x28)) {
    hVar1 = (hfp->format).format;
    if ((hVar1 == vcf) || (hVar1 == text_format)) {
      iVar3 = vcf_write(hfp,h,v);
      return iVar3;
    }
    if (v->errcode != 0) {
      fprintf(_stderr,"[%s:%d %s] Unchecked error (%d), exiting.\n",
              "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
              ,0x49b,"bcf_write");
      goto LAB_0011775e;
    }
    bcf1_sync(v);
    fp = (hfp->fp).bgzf;
    x[0] = (int)(v->shared).l + 0x18;
    x[1] = (uint32_t)(v->indiv).l;
    x[2] = v->rid;
    x[3] = v->pos;
    x[4] = v->rlen;
    x[5] = (uint32_t)v->qual;
    uVar2 = *(undefined8 *)&v->field_0x10;
    x[6] = (uint32_t)uVar2;
    x[7] = (uint)((ulong)uVar2 >> 0x28) | (uint)((ulong)uVar2 >> 8) & 0xff000000;
    sVar4 = bgzf_write(fp,x,0x20);
    iVar3 = -1;
    if (sVar4 == 0x20) {
      sVar5 = bgzf_write(fp,(v->shared).s,(v->shared).l);
      if (sVar5 == (v->shared).l) {
        sVar5 = bgzf_write(fp,(v->indiv).s,(v->indiv).l);
        iVar3 = -(uint)(sVar5 != (v->indiv).l);
      }
    }
  }
  else {
    fprintf(_stderr,
            "[%s:%d %s] Broken VCF record, the number of columns at %s:%d does not match the number of samples (%d vs %d).\n"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
            ,0x48e,"bcf_write",h->id[1][v->rid].key,(ulong)(v->pos + 1),
            *(ulong *)&v->field_0x10 >> 0x28,(ulong)(uint)h->n[2]);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int bcf_write(htsFile *hfp, const bcf_hdr_t *h, bcf1_t *v)
{
    if ( h->dirty )
    {
        // we could as well call bcf_hdr_sync here, not sure
        fprintf(stderr,"FIXME: dirty header not synced\n");
        exit(1);
    }
    if ( bcf_hdr_nsamples(h)!=v->n_sample )
    {
        fprintf(stderr,"[%s:%d %s] Broken VCF record, the number of columns at %s:%d does not match the number of samples (%d vs %d).\n",
                __FILE__,__LINE__,__FUNCTION__,bcf_seqname(h,v),v->pos+1, v->n_sample,bcf_hdr_nsamples(h));
        return -1;
    }

    if ( hfp->format.format == vcf || hfp->format.format == text_format )
        return vcf_write(hfp,h,v);

    if ( v->errcode )
    {
        // vcf_parse1() encountered a new contig or tag, undeclared in the
        // header.  At this point, the header must have been printed,
        // proceeding would lead to a broken BCF file. Errors must be checked
        // and cleared by the caller before we can proceed.
        fprintf(stderr,"[%s:%d %s] Unchecked error (%d), exiting.\n", __FILE__,__LINE__,__FUNCTION__,v->errcode);
        exit(1);
    }
    bcf1_sync(v);   // check if the BCF record was modified

    BGZF *fp = hfp->fp.bgzf;
    uint32_t x[8];
    x[0] = v->shared.l + 24; // to include six 32-bit integers
    x[1] = v->indiv.l;
    memcpy(x + 2, v, 16);
    x[6] = (uint32_t)v->n_allele<<16 | v->n_info;
    x[7] = (uint32_t)v->n_fmt<<24 | v->n_sample;
    if ( bgzf_write(fp, x, 32) != 32 ) return -1;
    if ( bgzf_write(fp, v->shared.s, v->shared.l) != v->shared.l ) return -1;
    if ( bgzf_write(fp, v->indiv.s, v->indiv.l) != v->indiv.l ) return -1;
    return 0;
}